

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O0

void * webfront::http::std::experimental::net::v1::detail::thread_info_base::
       allocate<std::experimental::net::v1::detail::thread_info_base::default_tag>
                 (long *param_1,long param_2)

{
  byte *pbVar1;
  ulong uVar2;
  void *pvVar3;
  uchar *mem;
  void *pointer;
  uchar *mem_1;
  void *pointer_1;
  size_t chunks;
  undefined1 local_4c;
  
  uVar2 = param_2 + 3U >> 2;
  if ((param_1 != (long *)0x0) && (*param_1 != 0)) {
    pbVar1 = (byte *)*param_1;
    *param_1 = 0;
    if (uVar2 <= *pbVar1) {
      pbVar1[param_2] = *pbVar1;
      return pbVar1;
    }
    operator_delete(pbVar1);
  }
  pvVar3 = operator_new(uVar2 * 4 + 1);
  if (uVar2 < 0x100) {
    local_4c = (undefined1)uVar2;
  }
  else {
    local_4c = 0;
  }
  *(undefined1 *)((long)pvVar3 + param_2) = local_4c;
  return pvVar3;
}

Assistant:

static void* allocate(Purpose, thread_info_base* this_thread,
      std::size_t size)
  {
    std::size_t chunks = (size + chunk_size - 1) / chunk_size;

    if (this_thread && this_thread->reusable_memory_[Purpose::mem_index])
    {
      void* const pointer = this_thread->reusable_memory_[Purpose::mem_index];
      this_thread->reusable_memory_[Purpose::mem_index] = 0;

      unsigned char* const mem = static_cast<unsigned char*>(pointer);
      if (static_cast<std::size_t>(mem[0]) >= chunks)
      {
        mem[size] = mem[0];
        return pointer;
      }

      ::operator delete(pointer);
    }

    void* const pointer = ::operator new(chunks * chunk_size + 1);
    unsigned char* const mem = static_cast<unsigned char*>(pointer);
    mem[size] = (chunks <= UCHAR_MAX) ? static_cast<unsigned char>(chunks) : 0;
    return pointer;
  }